

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O1

int32_t icu_63::HebrewCalendar::startOfYear(int32_t year,UErrorCode *status)

{
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_HEBREW_CALENDAR,calendar_hebrew_cleanup);
  iVar1 = CalendarCache::get(&gCache,year,status);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar5 = (year * 0xeb + -0xea) / 0x13;
  lVar4 = (long)iVar5 * 0x35b9 + 0x2f34;
  iVar6 = (int)(lVar4 / 0x6540) + iVar5 * 0x1d;
  lVar4 = lVar4 % 0x6540;
  uVar2 = iVar6 % 7;
  iVar5 = iVar6;
  if ((uVar2 < 7) && ((0x54U >> (uVar2 & 0x1f) & 1) != 0)) {
    iVar5 = iVar6 + 1;
    iVar3 = (int)((ulong)((long)iVar5 * -0x6db6db6d) >> 0x20) + iVar6 + 1;
    uVar2 = ((iVar3 >> 2) - (iVar3 >> 0x1f)) * -7 + iVar6 + 1;
  }
  if ((0x4014 < lVar4) && (uVar2 == 1)) {
    iVar3 = (year * 0xc + 0x11) % 0x13;
    iVar6 = 0xc;
    if (iVar3 < 0) {
      iVar6 = -7;
    }
    if (iVar3 < iVar6) {
      iVar5 = iVar5 + 2;
      goto LAB_001e7bb9;
    }
  }
  if ((0x5ae5 < lVar4) && (uVar2 == 0)) {
    iVar3 = (year * 0xc + 5) % 0x13;
    iVar6 = 0xc;
    if (iVar3 < 0) {
      iVar6 = -7;
    }
    iVar5 = iVar5 + (uint)(iVar6 <= iVar3);
  }
LAB_001e7bb9:
  CalendarCache::put(&gCache,year,iVar5,status);
  return iVar5;
}

Assistant:

int32_t HebrewCalendar::startOfYear(int32_t year, UErrorCode &status)
{
    ucln_i18n_registerCleanup(UCLN_I18N_HEBREW_CALENDAR, calendar_hebrew_cleanup);
    int32_t day = CalendarCache::get(&gCache, year, status);

    if (day == 0) {
        int32_t months = (235 * year - 234) / 19;           // # of months before year

        int64_t frac = (int64_t)months * MONTH_FRACT + BAHARAD;  // Fractional part of day #
        day  = months * 29 + (int32_t)(frac / DAY_PARTS);        // Whole # part of calculation
        frac = frac % DAY_PARTS;                        // Time of day

        int32_t wd = (day % 7);                        // Day of week (0 == Monday)

        if (wd == 2 || wd == 4 || wd == 6) {
            // If the 1st is on Sun, Wed, or Fri, postpone to the next day
            day += 1;
            wd = (day % 7);
        }
        if (wd == 1 && frac > 15*HOUR_PARTS+204 && !isLeapYear(year) ) {
            // If the new moon falls after 3:11:20am (15h204p from the previous noon)
            // on a Tuesday and it is not a leap year, postpone by 2 days.
            // This prevents 356-day years.
            day += 2;
        }
        else if (wd == 0 && frac > 21*HOUR_PARTS+589 && isLeapYear(year-1) ) {
            // If the new moon falls after 9:32:43 1/3am (21h589p from yesterday noon)
            // on a Monday and *last* year was a leap year, postpone by 1 day.
            // Prevents 382-day years.
            day += 1;
        }
        CalendarCache::put(&gCache, year, day, status);
    }
    return day;
}